

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_option_opts_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *pfVar1;
  char *pcVar2;
  pointer pcVar3;
  Option *pOVar4;
  undefined8 uVar5;
  size_t sVar6;
  int iVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  string *psVar10;
  stringstream out;
  undefined1 local_2c0 [40];
  size_t local_298;
  string local_290;
  FormatterBase *local_270;
  Option *local_268;
  string *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_270 = &this->super_FormatterBase;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_268 = opt;
  if (opt->type_size_ != 0) {
    if ((opt->type_name_).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    pfVar1 = &opt->type_name_;
    (*(opt->type_name_)._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
               (_Any_data *)pfVar1);
    uVar5 = local_2c0._8_8_;
    pcVar2 = local_2c0 + 0x10;
    if ((char *)local_2c0._0_8_ != pcVar2) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    opt = local_268;
    if (uVar5 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      if ((opt->type_name_).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*(opt->type_name_)._M_invoker)(&local_1d8,(_Any_data *)pfVar1);
      FormatterBase::get_label((string *)local_2c0,local_270,&local_1d8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
      if ((char *)local_2c0._0_8_ != pcVar2) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = (opt->defaultval_)._M_dataplus._M_p;
    local_2c0._0_8_ = pcVar2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c0,pcVar3,pcVar3 + (opt->defaultval_)._M_string_length);
    uVar5 = local_2c0._8_8_;
    if ((char *)local_2c0._0_8_ != pcVar2) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    if (uVar5 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"=",1);
      pcVar3 = (opt->defaultval_)._M_dataplus._M_p;
      local_2c0._0_8_ = pcVar2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c0,pcVar3,pcVar3 + (opt->defaultval_)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
      if ((char *)local_2c0._0_8_ != pcVar2) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
    }
    iVar7 = opt->expected_;
    if (1 < iVar7) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," x ",3);
      ::std::ostream::operator<<((ostream *)local_1a8,opt->expected_);
      iVar7 = opt->expected_;
    }
    if (iVar7 == -1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ...",4);
    }
    if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"REQUIRED","");
      FormatterBase::get_label((string *)local_2c0,local_270,&local_1f8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
      if ((char *)local_2c0._0_8_ != pcVar2) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar3 = (opt->envname_)._M_dataplus._M_p;
  local_2c0._0_8_ = local_2c0 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_2c0,pcVar3,pcVar3 + (opt->envname_)._M_string_length);
  uVar5 = local_2c0._8_8_;
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (uVar5 != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (",2);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Env","");
    FormatterBase::get_label((string *)local_2c0,local_270,&local_218);
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    pcVar3 = (local_268->envname_)._M_dataplus._M_p;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar3,pcVar3 + (local_268->envname_)._M_string_length);
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_290._M_dataplus._M_p,local_290._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    opt = local_268;
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
              *)local_2c0,&(opt->requires_)._M_t);
  sVar6 = local_298;
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
               *)local_2c0);
  local_260 = __return_storage_ptr__;
  if (sVar6 != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Needs","");
    FormatterBase::get_label((string *)local_2c0,local_270,&local_238);
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                *)local_2c0,&(opt->requires_)._M_t);
    if ((_Rb_tree_node_base *)local_2c0._24_8_ != (_Rb_tree_node_base *)(local_2c0 + 8)) {
      p_Var9 = (_Rb_tree_node_base *)local_2c0._24_8_;
      do {
        pOVar4 = *(Option **)(p_Var9 + 1);
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        Option::get_name_abi_cxx11_(&local_290,pOVar4,false,false);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != (_Rb_tree_node_base *)(local_2c0 + 8));
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                 *)local_2c0);
    opt = local_268;
  }
  psVar10 = local_260;
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
              *)local_2c0,&(opt->excludes_)._M_t);
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
               *)local_2c0);
  if (local_298 != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Excludes","");
    FormatterBase::get_label((string *)local_2c0,local_270,&local_258);
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                *)local_2c0,&(opt->excludes_)._M_t);
    if ((_Rb_tree_node_base *)local_2c0._24_8_ != (_Rb_tree_node_base *)(local_2c0 + 8)) {
      p_Var9 = (_Rb_tree_node_base *)local_2c0._24_8_;
      do {
        pOVar4 = *(Option **)(p_Var9 + 1);
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        Option::get_name_abi_cxx11_(&local_290,pOVar4,false,false);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != (_Rb_tree_node_base *)(local_2c0 + 8));
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree((_Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                 *)local_2c0);
    psVar10 = local_260;
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar10;
}

Assistant:

inline std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(opt->get_type_size() != 0) {
        if(!opt->get_type_name().empty())
            out << " " << get_label(opt->get_type_name());
        if(!opt->get_defaultval().empty())
            out << "=" << opt->get_defaultval();
        if(opt->get_expected() > 1)
            out << " x " << opt->get_expected();
        if(opt->get_expected() == -1)
            out << " ...";
        if(opt->get_required())
            out << " " << get_label("REQUIRED");
    }
    if(!opt->get_envname().empty())
        out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
    if(!opt->get_needs().empty()) {
        out << " " << get_label("Needs") << ":";
        for(const Option *op : opt->get_needs())
            out << " " << op->get_name();
    }
    if(!opt->get_excludes().empty()) {
        out << " " << get_label("Excludes") << ":";
        for(const Option *op : opt->get_excludes())
            out << " " << op->get_name();
    }
    return out.str();
}